

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

bool __thiscall
ExecutionEngine::doesMethodExist
          (ExecutionEngine *this,ClassRuntime *classRuntime,string *name,string *descriptor)

{
  undefined2 index;
  undefined2 index_00;
  bool bVar1;
  __type _Var2;
  ClassFile *pCVar3;
  char *pcVar4;
  allocator local_a9;
  string local_a8 [8];
  string methodDesc;
  allocator local_71;
  string local_70 [8];
  string methodName;
  int local_4c;
  u2 uStack_46;
  int i;
  method_info method;
  bool found;
  ClassFile *classFile;
  string *descriptor_local;
  string *name_local;
  ClassRuntime *classRuntime_local;
  ExecutionEngine *this_local;
  
  pCVar3 = ClassRuntime::getClassFile(classRuntime);
  method.attributes._7_1_ = false;
  local_4c = 0;
  while( true ) {
    if ((int)(uint)pCVar3->methods_count <= local_4c) {
      return method.attributes._7_1_;
    }
    index = pCVar3->methods[local_4c].name_index;
    index_00 = pCVar3->methods[local_4c].descriptor_index;
    pcVar4 = getFormattedConstant(pCVar3->constant_pool,index);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,pcVar4,&local_71);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    pcVar4 = getFormattedConstant(pCVar3->constant_pool,index_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,pcVar4,&local_a9);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_70,name);
    if ((_Var2) &&
       (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_a8,descriptor), _Var2)) {
      method.attributes._7_1_ = true;
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_70);
    if (bVar1) break;
    local_4c = local_4c + 1;
  }
  return method.attributes._7_1_;
}

Assistant:

bool ExecutionEngine::doesMethodExist(ClassRuntime *classRuntime, string name, string descriptor) {
    ClassFile *classFile = classRuntime->getClassFile();

    bool found = false;
    method_info method;
    for (int i = 0; i < classFile->methods_count; i++) {
        method = classFile->methods[i];
        string methodName = getFormattedConstant(classFile->constant_pool, method.name_index);
        string methodDesc = getFormattedConstant(classFile->constant_pool, method.descriptor_index);

        if (methodName == name && methodDesc == descriptor) {
            found = true;
            break;
        }
    }

    return found;
}